

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::ShaderCompilerCase::ShaderCompilerCase
          (ShaderCompilerCase *this,Context *context,char *name,char *description,int caseID,
          bool avoidCache,bool addWhitespaceAndComments)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  int iVar4;
  deUint64 v;
  deUint64 v_00;
  int iVar5;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderCompilerMandelbrotCase_01e46680;
  this->m_viewportWidth = 0;
  this->m_viewportHeight = 0;
  this->m_avoidCache = avoidCache;
  this->m_addWhitespaceAndComments = addWhitespaceAndComments;
  v = deGetTime();
  v_00 = deGetMicroseconds();
  dVar1 = deUint64Hash(v);
  dVar2 = deUint64Hash(v_00);
  dVar3 = ::deInt32Hash(caseID);
  this->m_startHash = dVar3 ^ dVar2 ^ dVar1;
  iVar4 = tcu::CommandLine::getTestIterationCount(context->m_testCtx->m_cmdLine);
  iVar5 = 0xf;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  this->m_minimumMeasurementCount = iVar5;
  this->m_maximumMeasurementCount = iVar5 * 3;
  return;
}

Assistant:

ShaderCompilerCase::ShaderCompilerCase (Context& context, const char* name, const char* description, int caseID, bool avoidCache, bool addWhitespaceAndComments)
	: TestCase								(context, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_viewportWidth						(0)
	, m_viewportHeight						(0)
	, m_avoidCache							(avoidCache)
	, m_addWhitespaceAndComments			(addWhitespaceAndComments)
	, m_startHash							((deUint32)(deUint64Hash(deGetTime()) ^ deUint64Hash(deGetMicroseconds()) ^ deInt32Hash(caseID)))
{
	int cmdLineIterCount = context.getTestContext().getCommandLine().getTestIterationCount();
	m_minimumMeasurementCount = cmdLineIterCount > 0 ? cmdLineIterCount : DEFAULT_MINIMUM_MEASUREMENT_COUNT;
	m_maximumMeasurementCount = m_minimumMeasurementCount*3;
}